

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

int kwsysSystem__AppendArgument
              (char **local,char ***begin,char ***end,int *size,char *arg_local,char **arg_begin,
              char **arg_end,int *arg_size)

{
  int iVar1;
  long lVar2;
  char **__dest;
  char *pcVar3;
  char **newPointers;
  kwsysSystem_ptrdiff_t length;
  char **arg_begin_local;
  char *arg_local_local;
  int *size_local;
  char ***end_local;
  char ***begin_local;
  char **local_local;
  
  iVar1 = kwsysSystem__AppendByte(arg_local,arg_begin,arg_end,arg_size,'\0');
  if (iVar1 == 0) {
    local_local._4_4_ = 0;
  }
  else {
    if ((long)*size <= (long)*end - (long)*begin >> 3) {
      lVar2 = (long)*end - (long)*begin >> 3;
      __dest = (char **)malloc((long)*size << 4);
      if (__dest == (char **)0x0) {
        return 0;
      }
      memcpy(__dest,*begin,lVar2 << 3);
      if (*begin != local) {
        free(*begin);
      }
      *begin = __dest;
      *end = *begin + lVar2;
      *size = *size << 1;
    }
    pcVar3 = (char *)malloc((long)*arg_end - (long)*arg_begin);
    **end = pcVar3;
    if (**end == (char *)0x0) {
      local_local._4_4_ = 0;
    }
    else {
      memcpy(**end,*arg_begin,(long)*arg_end - (long)*arg_begin);
      *end = *end + 1;
      *arg_end = *arg_begin;
      local_local._4_4_ = 1;
    }
  }
  return local_local._4_4_;
}

Assistant:

static int kwsysSystem__AppendArgument(char** local,
                                       char*** begin, char*** end,
                                       int* size,
                                       char* arg_local,
                                       char** arg_begin, char** arg_end,
                                       int* arg_size)
{
  /* Append a null-terminator to the argument string.  */
  if(!kwsysSystem__AppendByte(arg_local, arg_begin, arg_end, arg_size, '\0'))
    {
    return 0;
    }

  /* Allocate space for the argument pointer.  */
  if((*end - *begin) >= *size)
    {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char** newPointers = (char**)malloc((size_t)(*size)*2*sizeof(char*));
    if(!newPointers)
      {
      return 0;
      }
    memcpy(newPointers, *begin, (size_t)(length)*sizeof(char*));
    if(*begin != local)
      {
      free(*begin);
      }
    *begin = newPointers;
    *end = *begin + length;
    *size *= 2;
    }

  /* Allocate space for the argument string.  */
  **end = (char*)malloc((size_t)(*arg_end - *arg_begin));
  if(!**end)
    {
    return 0;
    }

  /* Store the argument in the command array.  */
  memcpy(**end, *arg_begin,(size_t)(*arg_end - *arg_begin));
  ++(*end);

  /* Reset the argument to be empty.  */
  *arg_end = *arg_begin;

  return 1;
}